

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QHeaderViewPrivate::LayoutChangeItem>::clear
          (QList<QHeaderViewPrivate::LayoutChangeItem> *this)

{
  Data *pDVar1;
  __off_t in_RDX;
  qsizetype capacity;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QHeaderViewPrivate::LayoutChangeItem>_*,_QHeaderViewPrivate::LayoutChangeItem_*>
  pVar2;
  QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size != 0) {
    pDVar1 = (this->d).d;
    if (pDVar1 == (Data *)0x0) {
      capacity = 0;
    }
    else {
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QtPrivate::QGenericArrayOps<QHeaderViewPrivate::LayoutChangeItem>::truncate
                    ((QGenericArrayOps<QHeaderViewPrivate::LayoutChangeItem> *)this,(char *)0x0,
                     in_RDX);
          return;
        }
        goto LAB_004fdb29;
      }
      capacity = (pDVar1->super_QArrayData).alloc;
    }
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (LayoutChangeItem *)&DAT_aaaaaaaaaaaaaaaa;
    pVar2 = QTypedArrayData<QHeaderViewPrivate::LayoutChangeItem>::allocate(capacity,KeepSize);
    local_28.d = (this->d).d;
    local_28.ptr = (this->d).ptr;
    (this->d).d = pVar2.first;
    (this->d).ptr = pVar2.second;
    local_28.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem>::~QArrayDataPointer(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_004fdb29:
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }